

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O2

void __thiscall
deci::parser_t::value_type::move<deci::ast_item_t*>(value_type *this,self_type *that)

{
  ast_item_t **u;
  
  u = as<deci::ast_item_t*>(that);
  emplace<deci::ast_item_t*,deci::ast_item_t*>(this,u);
  destroy<deci::ast_item_t*>(that);
  return;
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }